

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O3

void lts2::PerformRIHTOnImage
               (Mat *anImage,Size *patchSize,Point *patchOffset,LBDOperator *LBD,Mat *result,
               int iterations,float sparsity,float patchMean)

{
  int iVar1;
  _InputArray *p_Var2;
  undefined8 uVar3;
  int iVar4;
  Mat *pMVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float patchMean_00;
  Rect ROI;
  Mat target;
  Mat inputPatch;
  Mat resultPatch;
  Mat freak;
  Mat patchOnes;
  Mat ocount;
  int local_450;
  int local_44c;
  int local_448;
  int local_444;
  Mat *local_440;
  Mat *local_438;
  LBDOperator *local_430;
  _OutputArray local_428;
  _InputArray local_410;
  Size local_3f8;
  _InputArray local_3f0 [4];
  string local_390 [3];
  Size local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [6] [16];
  Mat local_2a8 [96];
  Mat local_248 [152];
  Mat local_1b0 [96];
  Mat local_150 [96];
  Mat local_f0 [96];
  _InputArray local_90 [4];
  
  local_430 = LBD;
  if ((*(uint *)anImage & 0xfff) == 5) {
    local_320 = CONCAT44((int)**(undefined8 **)(anImage + 0x40),
                         (int)((ulong)**(undefined8 **)(anImage + 0x40) >> 0x20));
    cv::Mat::create(result,&local_320,5);
    local_90[0].obj = local_318;
    local_308[0] = (undefined1  [16])0x0;
    local_318 = (undefined1  [16])0x0;
    local_90[0].flags = -0x3efdfffa;
    local_90[0].sz = (Size)&DAT_400000001;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)result,local_90);
    local_328 = CONCAT44((int)**(undefined8 **)(anImage + 0x40),
                         (int)((ulong)**(undefined8 **)(anImage + 0x40) >> 0x20));
    local_308[0] = (undefined1  [16])0x0;
    local_318 = (undefined1  [16])0x0;
    local_438 = anImage;
    cv::Mat::Mat((Mat *)local_90,&local_328,5,local_318);
    local_330 = *patchSize;
    cv::Mat::ones(local_318,&local_330,5);
    local_440 = result;
    cv::Mat::Mat(local_f0);
    (**(code **)(*(long *)local_318._0_8_ + 0x18))(local_318._0_8_,local_318,local_f0,0xffffffff);
    cv::Mat::~Mat(local_248);
    cv::Mat::~Mat(local_2a8);
    cv::Mat::~Mat((Mat *)local_308);
    cv::Mat::Mat((Mat *)local_318);
    cv::Mat::Mat(local_150);
    cv::Mat::Mat(local_1b0);
    iVar1 = patchOffset->x;
    if (iVar1 < 2) {
      iVar1 = 1;
    }
    iVar7 = 1;
    if (1 < patchOffset->y) {
      iVar7 = patchOffset->y;
    }
    patchOffset->x = iVar1;
    patchOffset->y = iVar7;
    iVar6 = *(int *)(local_438 + 8);
    if (0 < iVar6) {
      iVar4 = *(int *)(local_438 + 0xc);
      iVar8 = 0;
      pMVar5 = local_438;
      do {
        if (0 < iVar4) {
          iVar7 = 0;
          do {
            local_448 = patchSize->width;
            local_444 = patchSize->height;
            local_450 = iVar7;
            local_44c = iVar8;
            if ((local_444 + iVar8 <= *(int *)(pMVar5 + 8)) && (local_448 + iVar7 <= iVar4)) {
              cv::Mat::Mat((Mat *)local_390,pMVar5,(Rect_ *)&local_450);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x2010000;
              local_3f0[0].obj = local_318;
              cv::Mat::copyTo((_OutputArray *)local_390);
              cv::Mat::~Mat((Mat *)local_390);
              patchMean_00 = patchMean;
              if (patchMean < 0.0) {
                local_3f0[0].sz.width = 0;
                local_3f0[0].sz.height = 0;
                local_3f0[0].flags = 0x1010000;
                local_3f0[0].obj = local_318;
                cv::noArray();
                cv::mean((_InputArray *)local_390,local_3f0);
                patchMean_00 = (float)(double)local_390[0]._M_dataplus._M_p;
              }
              (*(local_430->super_LinearOperator)._vptr_LinearOperator[2])
                        (local_430,local_318,local_150);
              local_3f8 = *patchSize;
              local_390[0]._M_dataplus._M_p = (pointer)&local_390[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"haar","");
              RealReconstructionWithIHT
                        (local_1b0,local_430,local_150,iterations,sparsity,&local_3f8,patchMean_00,2
                         ,local_390);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_390[0]._M_dataplus._M_p != &local_390[0].field_2) {
                operator_delete(local_390[0]._M_dataplus._M_p,
                                local_390[0].field_2._M_allocated_capacity + 1);
              }
              cv::Mat::Mat((Mat *)local_390,local_440,(Rect_ *)&local_450);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x1010000;
              local_410.sz.width = 0;
              local_410.sz.height = 0;
              local_410.flags = 0x1010000;
              local_410.obj = local_1b0;
              local_428.super__InputArray.sz.width = 0;
              local_428.super__InputArray.sz.height = 0;
              local_428.super__InputArray.flags = -0x3dff0000;
              local_428.super__InputArray.obj = local_390;
              local_3f0[0].obj = local_390;
              p_Var2 = (_InputArray *)cv::noArray();
              cv::add(local_3f0,&local_410,&local_428,p_Var2,-1);
              cv::Mat::Mat((Mat *)local_3f0,(Mat *)local_90,(Rect_ *)&local_450);
              cv::Mat::operator=((Mat *)local_390,(Mat *)local_3f0);
              cv::Mat::~Mat((Mat *)local_3f0);
              local_3f0[0].sz.width = 0;
              local_3f0[0].sz.height = 0;
              local_3f0[0].flags = 0x1010000;
              local_410.sz.width = 0;
              local_410.sz.height = 0;
              local_410.flags = 0x1010000;
              local_410.obj = local_f0;
              local_428.super__InputArray.sz.width = 0;
              local_428.super__InputArray.sz.height = 0;
              local_428.super__InputArray.flags = -0x3dff0000;
              local_428.super__InputArray.obj = local_390;
              local_3f0[0].obj = local_390;
              p_Var2 = (_InputArray *)cv::noArray();
              cv::add(local_3f0,&local_410,&local_428,p_Var2,-1);
              cv::Mat::~Mat((Mat *)local_390);
              iVar1 = patchOffset->x;
              iVar4 = *(int *)(local_438 + 0xc);
              pMVar5 = local_438;
            }
            iVar7 = iVar7 + iVar1;
          } while (iVar7 < iVar4);
          iVar7 = patchOffset->y;
          iVar6 = *(int *)(pMVar5 + 8);
        }
        iVar8 = iVar8 + iVar7;
      } while (iVar8 < iVar6);
    }
    finalize(local_440,(Mat *)local_90[0].sz);
    cv::Mat::~Mat(local_1b0);
    cv::Mat::~Mat(local_150);
    cv::Mat::~Mat((Mat *)local_318);
    cv::Mat::~Mat(local_f0);
    cv::Mat::~Mat((Mat *)local_90);
    return;
  }
  local_318._8_8_ = local_318._0_8_;
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,"anImage.type() == CV_32F && anImage.channels() == 1","");
  uVar3 = cv::error(-0xd7,(string *)local_318,"PerformRIHTOnImage",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                    ,0x371);
  if ((undefined1 (*) [16])local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,local_308[0]._0_8_ + 1);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

void lts2::PerformRIHTOnImage(cv::Mat const &anImage, cv::Size patchSize, cv::Point patchOffset,
                             LBDOperator &LBD, cv::Mat &result, int iterations, float sparsity, float patchMean)
{
  CV_Assert(anImage.type() == CV_32F && anImage.channels() == 1);

  // Result image
  result.create(anImage.size(), CV_32F);
  result.setTo(cv::Scalar(0));

  cv::Mat ocount(anImage.size(), CV_32FC1, cv::Scalar(0));
  cv::Mat patchOnes = cv::Mat::ones(patchSize, CV_32FC1);


  // Loop over the patches
  cv::Mat inputPatch, freak;
  cv::Mat resultPatch;
  patchOffset.x = MAX(1, patchOffset.x);
  patchOffset.y = MAX(1, patchOffset.y);

  for (int y = 0; y < anImage.rows; y += patchOffset.y)
    for (int x = 0; x < anImage.cols; x += patchOffset.x)
    {
      cv::Rect ROI(x, y, patchSize.width, patchSize.height);
      if ( y+patchSize.height > anImage.rows ||
           x+patchSize.width > anImage.cols )
        continue;

      anImage(ROI).copyTo(inputPatch);
      float pmean = patchMean;
      if (pmean < 0.0)
      {
        cv::Scalar mean = cv::mean(inputPatch);
        pmean = (float)mean[0];
      }

      LBD.Apply(inputPatch, freak);

      lts2::RealReconstructionWithIHT(resultPatch, LBD, freak,
                                      iterations, sparsity, patchSize, pmean);

      cv::Mat target = result(ROI);
      target += resultPatch;

      target = ocount(ROI);
      target += patchOnes;
    }

  finalize(result, ocount);
}